

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O2

void event_signal_size(game_event_type type,wchar_t h,wchar_t w)

{
  game_event_data data;
  game_event_data local_30;
  
  local_30.point.x = h;
  local_30.point.y = w;
  game_event_dispatch(type,&local_30);
  return;
}

Assistant:

void event_signal_size(game_event_type type, int h, int w)
{
	game_event_data data;

	data.size.h = h;
	data.size.w = w;
	game_event_dispatch(type, &data);
}